

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cc
# Opt level: O0

void __thiscall tchecker::if_statement_t::~if_statement_t(if_statement_t *this)

{
  if_statement_t *this_local;
  
  ~if_statement_t(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

std::ostream & if_statement_t::output(std::ostream & os) const
{
  os << "if ";
  _condition->output(os);
  os <<  " then ";
  _then_stmt->output(os);
  os << " else ";
  _else_stmt->output(os);
  os  << " endif";
  return os;
}